

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O0

bool __thiscall adios2::query::QueryVar::TouchSelection(QueryVar *this,Dims *start,Dims *count)

{
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  value_type vVar4;
  size_type sVar5;
  reference pvVar6;
  const_reference pvVar7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  long in_RDI;
  size_t selEnd;
  size_t end;
  size_t i;
  size_t dimensionsSize;
  size_type local_30;
  
  sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x70));
  if (sVar5 != 0) {
    sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RSI);
    for (local_30 = 0; local_30 < sVar5; local_30 = local_30 + 1) {
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_RSI,local_30);
      vVar1 = *pvVar6;
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_RDX,local_30);
      vVar2 = *pvVar6;
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x70),
                          local_30);
      vVar3 = *pvVar7;
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x88),
                          local_30);
      vVar4 = *pvVar7;
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x70),
                          local_30);
      if (vVar1 + vVar2 <= *pvVar7) {
        return false;
      }
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_RSI,local_30);
      if (vVar3 + vVar4 <= *pvVar6) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool QueryVar::TouchSelection(adios2::Dims &start, adios2::Dims &count) const
{
    if (0 == m_Selection.first.size())
        return true;

    const size_t dimensionsSize = start.size();

    for (size_t i = 0; i < dimensionsSize; i++)
    {
        size_t end = start[i] + count[i];
        size_t selEnd = m_Selection.first[i] + m_Selection.second[i];

        if (end <= m_Selection.first[i])
            return false;
        if (selEnd <= start[i])
            return false;
    }
    return true;
}